

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int multiSelect(Parse *pParse,Select *p,SelectDest *pDest)

{
  byte *pbVar1;
  u32 *puVar2;
  u8 uVar3;
  short sVar4;
  undefined4 p1;
  sqlite3 *psVar5;
  undefined4 uVar9;
  SrcList *pSVar6;
  Vdbe *p_00;
  Parse *pPVar7;
  int *piVar8;
  ushort uVar10;
  bool bVar11;
  byte bVar12;
  LogEst LVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  uint p2;
  uint uVar19;
  uint p2_00;
  int iVar20;
  int iVar21;
  Vdbe *pVVar22;
  int *piVar23;
  ExprList *pEVar24;
  KeyInfo *pKVar25;
  CollSeq *pCVar26;
  Op *pOVar27;
  Expr *pEVar28;
  int iVar29;
  char *pcVar30;
  long lVar31;
  anon_union_4_2_6146edf4_for_u *paVar32;
  Select *pSVar33;
  int extraout_EDX;
  int iVar34;
  int nExtra;
  char *pcVar35;
  u8 uVar36;
  bool bVar37;
  int iVar38;
  ulong uVar39;
  int iVar40;
  Select *pSVar41;
  Select *pSVar42;
  ushort uVar43;
  int iVar44;
  KeyInfo *local_e0;
  SelectDest destA;
  SelectDest dest;
  SelectDest local_50;
  
  psVar5 = pParse->db;
  pSVar42 = p->pPrior;
  dest.eDest = pDest->eDest;
  dest._1_3_ = *(undefined3 *)&pDest->field_0x1;
  dest.iSDParm = pDest->iSDParm;
  dest.iSdst = pDest->iSdst;
  dest.nSdst = pDest->nSdst;
  dest.zAffSdst._0_4_ = *(undefined4 *)&pDest->zAffSdst;
  dest.zAffSdst._4_4_ = *(undefined4 *)((long)&pDest->zAffSdst + 4);
  dest.pOrderBy._0_4_ = *(undefined4 *)&pDest->pOrderBy;
  dest.pOrderBy._4_4_ = *(undefined4 *)((long)&pDest->pOrderBy + 4);
  if (pSVar42->pOrderBy == (ExprList *)0x0) {
    if (pSVar42->pLimit == (Expr *)0x0) {
      pVVar22 = sqlite3GetVdbe(pParse);
      uVar36 = dest.eDest;
      if (dest.eDest == '\f') {
        sqlite3VdbeAddOp3(pVVar22,0x71,dest.iSDParm,p->pEList->nExpr,0);
        dest.eDest = '\x0e';
        uVar36 = '\x0e';
      }
      if ((p->selFlags >> 10 & 1) != 0) {
        pEVar28 = p->pLimit;
        uVar10 = (ushort)(pEVar28 == (Expr *)0x0);
        uVar43 = uVar10 ^ 1;
        do {
          pSVar42 = p;
          uVar43 = uVar43 + uVar10;
          p = pSVar42->pPrior;
        } while (pSVar42->pPrior != (Select *)0x0);
        sqlite3VdbeExplain(pParse,'\0',"SCAN %d CONSTANT ROW%s");
        do {
          selectInnerLoop(pParse,pSVar42,-1,(SortCtx *)0x0,(DistinctCtx *)0x0,&dest,1,1);
          if (pEVar28 != (Expr *)0x0) break;
          pSVar42->nSelectRow = uVar43;
          pSVar42 = pSVar42->pNext;
        } while (pSVar42 != (Select *)0x0);
        iVar20 = 0;
        goto LAB_00172593;
      }
      if ((p->selFlags >> 0xd & 1) != 0) {
        if (p->pWin == (Window *)0x0) {
          pSVar6 = p->pSrc;
          iVar20 = p->pEList->nExpr;
          p_00 = pParse->pVdbe;
          pSVar42 = p->pPrior;
          iVar34 = sqlite3AuthCheck(pParse,0x21,(char *)0x0,(char *)0x0,(char *)0x0);
          if (iVar34 == 0) {
            uVar14 = sqlite3VdbeMakeLabel((Vdbe *)p_00->pParse);
            p->nSelectRow = 0x140;
            computeLimitRegisters(pParse,p,uVar14);
            pEVar28 = p->pLimit;
            iVar34 = p->iLimit;
            iVar18 = p->iOffset;
            p->pLimit = (Expr *)0x0;
            p->iLimit = 0;
            p->iOffset = 0;
            iVar44 = 0;
            if (0 < (long)pSVar6->nSrc) {
              lVar31 = 0;
              do {
                if (((&pSVar6->a[0].fg.field_0x1)[lVar31] & 0x20) != 0) {
                  iVar44 = *(int *)((long)&pSVar6->a[0].iCursor + lVar31);
                  goto LAB_001732b6;
                }
                lVar31 = lVar31 + 0x70;
              } while ((long)pSVar6->nSrc * 0x70 - lVar31 != 0);
              iVar44 = 0;
            }
LAB_001732b6:
            pEVar24 = p->pOrderBy;
            iVar38 = pParse->nTab;
            iVar21 = iVar38 + 1;
            pParse->nTab = iVar21;
            if (p->op == '{') {
              bVar12 = (pEVar24 != (ExprList *)0x0) * '\x02' + 6;
              pParse->nTab = iVar38 + 2;
            }
            else {
              bVar12 = (pEVar24 != (ExprList *)0x0) * '\x02' | 5;
              iVar21 = 0;
            }
            destA.eDest = bVar12;
            destA.iSDParm = iVar38;
            destA.iSdst = 0;
            destA.nSdst = 0;
            destA.zAffSdst = (char *)0x0;
            iVar29 = pParse->nMem + 1;
            pParse->nMem = iVar29;
            sqlite3VdbeAddOp3(p_00,0x74,iVar44,iVar29,iVar20);
            if (pEVar24 == (ExprList *)0x0) {
              sqlite3VdbeAddOp3(p_00,0x71,iVar38,iVar20,0);
            }
            else {
              pKVar25 = multiSelectOrderByKeyInfo(pParse,p,nExtra);
              iVar20 = sqlite3VdbeAddOp3(p_00,0x71,iVar38,pEVar24->nExpr + 2,0);
              sqlite3VdbeChangeP4(p_00,iVar20,(char *)pKVar25,-9);
              destA.pOrderBy = pEVar24;
            }
            if (iVar21 != 0) {
              iVar20 = sqlite3VdbeAddOp3(p_00,0x71,iVar21,0,0);
              p->addrOpenEphm[0] = iVar20;
              *(byte *)&p->selFlags = (byte)p->selFlags | 0x20;
            }
            p->pOrderBy = (ExprList *)0x0;
            pSVar42->pNext = (Select *)0x0;
            sqlite3VdbeExplain(pParse,'\x01',"SETUP");
            iVar20 = sqlite3Select(pParse,pSVar42,&destA);
            pSVar42->pNext = p;
            if (iVar20 == 0) {
              iVar20 = sqlite3VdbeAddOp3(p_00,0x24,iVar38,uVar14,0);
              sqlite3VdbeAddOp3(p_00,0x82,iVar44,0,0);
              if (pEVar24 == (ExprList *)0x0) {
                iVar16 = 0x80;
                iVar40 = 0;
                iVar21 = iVar29;
              }
              else {
                iVar16 = 0x5a;
                iVar21 = pEVar24->nExpr + 1;
                iVar40 = iVar29;
              }
              sqlite3VdbeAddOp3(p_00,iVar16,iVar38,iVar21,iVar40);
              sqlite3VdbeAddOp3(p_00,0x7c,iVar38,0,0);
              uVar15 = sqlite3VdbeMakeLabel((Vdbe *)p_00->pParse);
              if (0 < iVar18) {
                sqlite3VdbeAddOp3(p_00,0x2f,iVar18,uVar15,1);
              }
              selectInnerLoop(pParse,p,iVar44,(SortCtx *)0x0,(DistinctCtx *)0x0,&dest,uVar15,uVar14)
              ;
              if (iVar34 != 0) {
                sqlite3VdbeAddOp3(p_00,0x31,iVar34,uVar14,0);
              }
              piVar23 = p_00->pParse->aLabel;
              if (piVar23 != (int *)0x0) {
                piVar23[(int)~uVar15] = p_00->nOp;
              }
              if ((p->selFlags & 8) == 0) {
                p->pPrior = (Select *)0x0;
                sqlite3VdbeExplain(pParse,'\x01',"RECURSIVE STEP");
                sqlite3Select(pParse,p,&destA);
                p->pPrior = pSVar42;
              }
              else {
                sqlite3ErrorMsg(pParse,"recursive aggregate queries not supported");
              }
              sqlite3VdbeAddOp3(p_00,0xb,0,iVar20,0);
              piVar23 = p_00->pParse->aLabel;
              if (piVar23 != (int *)0x0) {
                piVar23[(int)~uVar14] = p_00->nOp;
              }
            }
            if (p->pOrderBy != (ExprList *)0x0) {
              exprListDeleteNN(pParse->db,p->pOrderBy);
            }
            p->pOrderBy = pEVar24;
            p->pLimit = pEVar28;
          }
        }
        else {
          sqlite3ErrorMsg(pParse,"cannot use window functions in recursive queries");
        }
        pSVar41 = (Select *)0x0;
        iVar20 = 0;
LAB_00173807:
        if ((p->selFlags & 0x20) != 0) {
          iVar34 = p->pEList->nExpr;
          pKVar25 = sqlite3KeyInfoAlloc(psVar5,iVar34,1);
          if (pKVar25 == (KeyInfo *)0x0) {
            iVar20 = 7;
          }
          else {
            if (iVar34 < 1) goto LAB_00173bd2;
            lVar31 = 0;
            do {
              pCVar26 = multiSelectCollSeq(pParse,p,(int)lVar31);
              pKVar25->aColl[lVar31] = pCVar26;
              if (pCVar26 == (CollSeq *)0x0) {
                pKVar25->aColl[lVar31] = psVar5->pDfltColl;
              }
              lVar31 = lVar31 + 1;
            } while (iVar34 != (int)lVar31);
            for (; p != (Select *)0x0; p = p->pPrior) {
LAB_00173bd2:
              lVar31 = 0;
              bVar11 = true;
              do {
                bVar37 = bVar11;
                iVar18 = p->addrOpenEphm[lVar31];
                if ((long)iVar18 < 0) break;
                if (pVVar22->db->mallocFailed == '\0') {
                  pOVar27 = pVVar22->aOp + iVar18;
                }
                else {
                  pOVar27 = (Op *)&sqlite3VdbeGetOp_dummy;
                }
                pOVar27->p2 = iVar34;
                pKVar25->nRef = pKVar25->nRef + 1;
                sqlite3VdbeChangeP4(pVVar22,iVar18,(char *)pKVar25,-9);
                p->addrOpenEphm[lVar31] = -1;
                lVar31 = 1;
                bVar11 = false;
              } while (bVar37);
            }
            pKVar25->nRef = pKVar25->nRef - 1;
            if (pKVar25->nRef == 0) {
              sqlite3DbFreeNN(pKVar25->db,pKVar25);
            }
          }
        }
        pDest->iSdst = dest.iSdst;
        pDest->nSdst = dest.nSdst;
        if (pSVar41 == (Select *)0x0) {
          return iVar20;
        }
        clearSelect(psVar5,pSVar41,1);
        return iVar20;
      }
      if (p->pOrderBy == (ExprList *)0x0) {
        if (pSVar42->pPrior == (Select *)0x0) {
          sqlite3VdbeExplain(pParse,'\x01',"COMPOUND QUERY");
          sqlite3VdbeExplain(pParse,'\x01',"LEFT-MOST SUBQUERY");
        }
        uVar3 = p->op;
        if ((uVar3 == '{') || (uVar3 == '}')) {
          iVar34 = dest.iSDParm;
          if (uVar36 != '\x01') {
            iVar34 = pParse->nTab;
            pParse->nTab = iVar34 + 1;
            iVar20 = sqlite3VdbeAddOp3(pVVar22,0x71,iVar34,0,0);
            p->addrOpenEphm[0] = iVar20;
            pSVar41 = p;
            do {
              pSVar33 = pSVar41;
              pSVar41 = pSVar33->pNext;
            } while (pSVar41 != (Select *)0x0);
            puVar2 = &pSVar33->selFlags;
            *(byte *)puVar2 = (byte)*puVar2 | 0x20;
          }
          destA.eDest = '\x01';
          destA.iSDParm = iVar34;
          destA.iSdst = 0;
          destA.nSdst = 0;
          destA.zAffSdst = (char *)0x0;
          iVar20 = sqlite3Select(pParse,pSVar42,&destA);
          if (iVar20 != 0) goto LAB_00172593;
          p->pPrior = (Select *)0x0;
          pEVar28 = p->pLimit;
          p->pLimit = (Expr *)0x0;
          destA.eDest = (p->op == '}') + '\x01';
          bVar12 = p->op + 0x84;
          if (bVar12 < 3) {
            pcVar35 = (&PTR_anon_var_dwarf_25839_001bddc0)[bVar12];
          }
          else {
            pcVar35 = "UNION";
          }
          sqlite3VdbeExplain(pParse,'\x01',"%s USING TEMP B-TREE",pcVar35);
          iVar20 = sqlite3Select(pParse,p,&destA);
          if (p->pOrderBy != (ExprList *)0x0) {
            exprListDeleteNN(psVar5,p->pOrderBy);
          }
          pSVar41 = p->pPrior;
          p->pPrior = pSVar42;
          p->pOrderBy = (ExprList *)0x0;
          if (p->op == '{') {
            LVar13 = sqlite3LogEstAdd(p->nSelectRow,pSVar42->nSelectRow);
            p->nSelectRow = LVar13;
          }
          if (p->pLimit != (Expr *)0x0) {
            sqlite3ExprDeleteNN(psVar5,p->pLimit);
          }
          p->pLimit = pEVar28;
          p->iLimit = 0;
          p->iOffset = 0;
          if (uVar36 != '\x01') {
            uVar14 = sqlite3VdbeMakeLabel((Vdbe *)pVVar22->pParse);
            uVar15 = sqlite3VdbeMakeLabel((Vdbe *)pVVar22->pParse);
            computeLimitRegisters(pParse,p,uVar14);
            sqlite3VdbeAddOp3(pVVar22,0x24,iVar34,uVar14,0);
            iVar18 = pVVar22->nOp;
            selectInnerLoop(pParse,p,iVar34,(SortCtx *)0x0,(DistinctCtx *)0x0,&dest,uVar15,uVar14);
            piVar23 = pVVar22->pParse->aLabel;
            if (piVar23 != (int *)0x0) {
              piVar23[(int)~uVar15] = pVVar22->nOp;
            }
            sqlite3VdbeAddOp3(pVVar22,5,iVar34,iVar18,0);
            piVar23 = pVVar22->pParse->aLabel;
            if (piVar23 != (int *)0x0) {
              piVar23[(int)~uVar14] = pVVar22->nOp;
            }
            sqlite3VdbeAddOp3(pVVar22,0x75,iVar34,0,0);
          }
        }
        else if (uVar3 == '|') {
          iVar20 = p->iOffset;
          pSVar42->iLimit = p->iLimit;
          pSVar42->iOffset = iVar20;
          pSVar42->pLimit = p->pLimit;
          iVar20 = sqlite3Select(pParse,pSVar42,&dest);
          p->pLimit = (Expr *)0x0;
          if (iVar20 != 0) goto LAB_00172593;
          p->pPrior = (Select *)0x0;
          p1 = pSVar42->iLimit;
          uVar9 = pSVar42->iOffset;
          p->iLimit = p1;
          p->iOffset = uVar9;
          if (p1 == 0) {
            iVar34 = 0;
          }
          else {
            iVar34 = sqlite3VdbeAddOp3(pVVar22,0x14,p1,0,0);
            iVar20 = p->iOffset;
            if (iVar20 != 0) {
              sqlite3VdbeAddOp3(pVVar22,0x99,p->iLimit,iVar20 + 1,iVar20);
            }
          }
          sqlite3VdbeExplain(pParse,'\x01',"UNION ALL");
          iVar20 = sqlite3Select(pParse,p,&dest);
          pSVar41 = p->pPrior;
          p->pPrior = pSVar42;
          LVar13 = sqlite3LogEstAdd(p->nSelectRow,pSVar42->nSelectRow);
          p->nSelectRow = LVar13;
          if (pSVar42->pLimit != (Expr *)0x0) {
            iVar18 = sqlite3ExprIsInteger(pSVar42->pLimit->pLeft,(int *)&destA);
            if ((0 < (int)destA._0_4_ && iVar18 != 0) &&
               (sVar4 = p->nSelectRow, LVar13 = sqlite3LogEst(destA._0_8_ & 0xffffffff),
               LVar13 < sVar4)) {
              p->nSelectRow = LVar13;
            }
          }
          if (iVar34 != 0) {
            if (pVVar22->db->mallocFailed == '\0') {
              iVar18 = pVVar22->nOp + -1;
              if (-1 < iVar34) {
                iVar18 = iVar34;
              }
              pOVar27 = pVVar22->aOp + iVar18;
            }
            else {
              pOVar27 = (Op *)&sqlite3VdbeGetOp_dummy;
            }
            pOVar27->p2 = pVVar22->nOp;
          }
        }
        else {
          iVar34 = pParse->nTab;
          pParse->nTab = iVar34 + 2;
          iVar20 = sqlite3VdbeAddOp3(pVVar22,0x71,iVar34,0,0);
          p->addrOpenEphm[0] = iVar20;
          pSVar41 = p;
          do {
            pSVar33 = pSVar41;
            pSVar41 = pSVar33->pNext;
          } while (pSVar41 != (Select *)0x0);
          puVar2 = &pSVar33->selFlags;
          *(byte *)puVar2 = (byte)*puVar2 | 0x20;
          destA.eDest = '\x01';
          destA.iSDParm = iVar34;
          destA.iSdst = 0;
          destA.nSdst = 0;
          destA.zAffSdst = (char *)0x0;
          iVar20 = sqlite3Select(pParse,pSVar42,&destA);
          if (iVar20 != 0) goto LAB_00172593;
          iVar18 = iVar34 + 1;
          iVar20 = sqlite3VdbeAddOp3(pVVar22,0x71,iVar18,0,0);
          p->addrOpenEphm[1] = iVar20;
          p->pPrior = (Select *)0x0;
          pEVar28 = p->pLimit;
          p->pLimit = (Expr *)0x0;
          destA.iSDParm = iVar18;
          bVar12 = p->op + 0x84;
          if (bVar12 < 3) {
            pcVar35 = (&PTR_anon_var_dwarf_25839_001bddc0)[bVar12];
          }
          else {
            pcVar35 = "UNION";
          }
          sqlite3VdbeExplain(pParse,'\x01',"%s USING TEMP B-TREE",pcVar35);
          iVar20 = sqlite3Select(pParse,p,&destA);
          pSVar41 = p->pPrior;
          p->pPrior = pSVar42;
          if (pSVar42->nSelectRow < p->nSelectRow) {
            p->nSelectRow = pSVar42->nSelectRow;
          }
          if (p->pLimit != (Expr *)0x0) {
            sqlite3ExprDeleteNN(psVar5,p->pLimit);
          }
          p->pLimit = pEVar28;
          uVar14 = sqlite3VdbeMakeLabel((Vdbe *)pVVar22->pParse);
          uVar15 = sqlite3VdbeMakeLabel((Vdbe *)pVVar22->pParse);
          computeLimitRegisters(pParse,p,uVar14);
          sqlite3VdbeAddOp3(pVVar22,0x24,iVar34,uVar14,0);
          if (pParse->nTempReg == '\0') {
            iVar44 = pParse->nMem + 1;
            pParse->nMem = iVar44;
          }
          else {
            bVar12 = pParse->nTempReg - 1;
            pParse->nTempReg = bVar12;
            iVar44 = pParse->aTempReg[bVar12];
          }
          iVar38 = sqlite3VdbeAddOp3(pVVar22,0x80,iVar34,iVar44,0);
          iVar21 = sqlite3VdbeAddOp3(pVVar22,0x1c,iVar18,uVar15,iVar44);
          if (pVVar22->db->mallocFailed == '\0') {
            pOVar27 = pVVar22->aOp;
            pOVar27[iVar21].p4type = -3;
            pOVar27[iVar21].p4.i = 0;
          }
          if (iVar44 != 0) {
            bVar12 = pParse->nTempReg;
            if ((ulong)bVar12 < 8) {
              pParse->nTempReg = bVar12 + 1;
              pParse->aTempReg[bVar12] = iVar44;
            }
          }
          selectInnerLoop(pParse,p,iVar34,(SortCtx *)0x0,(DistinctCtx *)0x0,&dest,uVar15,uVar14);
          piVar23 = pVVar22->pParse->aLabel;
          if (piVar23 != (int *)0x0) {
            piVar23[(int)~uVar15] = pVVar22->nOp;
          }
          sqlite3VdbeAddOp3(pVVar22,5,iVar34,iVar38,0);
          piVar23 = pVVar22->pParse->aLabel;
          if (piVar23 != (int *)0x0) {
            piVar23[(int)~uVar14] = pVVar22->nOp;
          }
          sqlite3VdbeAddOp3(pVVar22,0x75,iVar18,0,0);
          sqlite3VdbeAddOp3(pVVar22,0x75,iVar34,0,0);
        }
        if (p->pNext == (Select *)0x0) {
          sqlite3VdbeExplainPop(pParse);
        }
        goto LAB_00173807;
      }
      psVar5 = pParse->db;
      pVVar22 = pParse->pVdbe;
      uVar14 = sqlite3VdbeMakeLabel((Vdbe *)pVVar22->pParse);
      uVar15 = sqlite3VdbeMakeLabel((Vdbe *)pVVar22->pParse);
      uVar36 = p->op;
      pSVar42 = p->pPrior;
      pEVar24 = p->pOrderBy;
      iVar20 = pEVar24->nExpr;
      if ((uVar36 != '|') && (psVar5->mallocFailed == '\0')) {
        uVar19 = 1;
        do {
          if (p->pEList->nExpr < (int)uVar19) break;
          if (iVar20 < 1) {
            iVar34 = 0;
LAB_0017312b:
            if (iVar34 == iVar20) goto LAB_00173130;
          }
          else {
            paVar32 = &pEVar24->a[0].u;
            iVar34 = 0;
            do {
              if (uVar19 == (paVar32->x).iOrderByCol) goto LAB_0017312b;
              iVar34 = iVar34 + 1;
              paVar32 = paVar32 + 8;
            } while (iVar20 != iVar34);
LAB_00173130:
            destA.eDest = '\0';
            destA._1_3_ = 0;
            destA.iSDParm = 0;
            destA._8_8_ = destA._8_8_ & 0xffffffff00000000;
            pEVar28 = sqlite3ExprAlloc(psVar5,0x8f,(Token *)&destA,0);
            if (pEVar28 == (Expr *)0x0) {
              return 7;
            }
            pbVar1 = (byte *)((long)&pEVar28->flags + 1);
            *pbVar1 = *pbVar1 | 4;
            (pEVar28->u).iValue = uVar19;
            pEVar24 = sqlite3ExprListAppend((Parse *)pParse->db,pEVar24,pEVar28);
            p->pOrderBy = pEVar24;
            if (pEVar24 == (ExprList *)0x0) {
              pEVar24 = (ExprList *)0x0;
            }
            else {
              lVar31 = (long)iVar20;
              iVar20 = iVar20 + 1;
              pEVar24->a[lVar31].u.x.iOrderByCol = (u16)uVar19;
            }
          }
          uVar19 = uVar19 + 1;
        } while (psVar5->mallocFailed == '\0');
      }
      piVar23 = (int *)sqlite3DbMallocRawNN(psVar5,(long)(int)(iVar20 + 1U) << 2);
      if (piVar23 == (int *)0x0) {
        local_e0 = (KeyInfo *)0x0;
      }
      else {
        *piVar23 = iVar20;
        iVar34 = extraout_EDX;
        if (0 < iVar20) {
          lVar31 = 0;
          do {
            iVar34 = (&pEVar24->a[0].u)[lVar31 * 2].x.iOrderByCol - 1;
            *(int *)((long)piVar23 + lVar31 + 4) = iVar34;
            lVar31 = lVar31 + 4;
          } while ((ulong)(iVar20 + 1U) * 4 + -4 != lVar31);
        }
        local_e0 = multiSelectOrderByKeyInfo(pParse,p,iVar34);
      }
      p->pOrderBy = pEVar24;
      pEVar24 = sqlite3ExprListDup(pParse->db,pEVar24,0);
      pSVar42->pOrderBy = pEVar24;
      if (uVar36 == '|') {
        iVar34 = 0;
LAB_001729f1:
        pKVar25 = (KeyInfo *)0x0;
      }
      else {
        uVar19 = p->pEList->nExpr;
        iVar34 = pParse->nMem + 1;
        pParse->nMem = pParse->nMem + uVar19 + 1;
        sqlite3VdbeAddOp3(pVVar22,0x46,0,iVar34,0);
        pKVar25 = sqlite3KeyInfoAlloc(psVar5,uVar19,1);
        if (pKVar25 == (KeyInfo *)0x0) goto LAB_001729f1;
        if (0 < (int)uVar19) {
          uVar39 = 0;
          do {
            pCVar26 = multiSelectCollSeq(pParse,p,(int)uVar39);
            pKVar25->aColl[uVar39] = pCVar26;
            pKVar25->aSortOrder[uVar39] = '\0';
            uVar39 = uVar39 + 1;
          } while (uVar19 != uVar39);
        }
      }
      p->pPrior = (Select *)0x0;
      pSVar42->pNext = (Select *)0x0;
      sqlite3ResolveOrderGroupBy(pParse,p,p->pOrderBy,"ORDER");
      iVar18 = 0;
      if (pSVar42->pPrior == (Select *)0x0) {
        sqlite3ResolveOrderGroupBy(pParse,pSVar42,pSVar42->pOrderBy,"ORDER");
      }
      computeLimitRegisters(pParse,p,uVar14);
      iVar44 = p->iLimit;
      iVar38 = 0;
      if (iVar44 != 0 && uVar36 == '|') {
        iVar18 = pParse->nMem + 1;
        iVar38 = pParse->nMem + 2;
        pParse->nMem = iVar38;
        iVar21 = p->iOffset + 1;
        if (p->iOffset == 0) {
          iVar21 = iVar44;
        }
        sqlite3VdbeAddOp3(pVVar22,0x4e,iVar21,iVar18,0);
        sqlite3VdbeAddOp3(pVVar22,0x4e,iVar18,iVar38,0);
      }
      if (p->pLimit != (Expr *)0x0) {
        sqlite3ExprDeleteNN(psVar5,p->pLimit);
      }
      p->pLimit = (Expr *)0x0;
      iVar40 = pParse->nMem;
      iVar44 = iVar40 + 1;
      iVar21 = iVar40 + 2;
      iVar29 = iVar40 + 4;
      pParse->nMem = iVar29;
      destA.eDest = '\r';
      destA.iSDParm = iVar44;
      destA.iSdst = 0;
      destA.nSdst = 0;
      destA.zAffSdst = (char *)0x0;
      local_50.eDest = '\r';
      local_50.iSdst = 0;
      local_50.nSdst = 0;
      local_50.zAffSdst = (char *)0x0;
      iVar40 = iVar40 + 3;
      local_50.iSDParm = iVar21;
      sqlite3VdbeExplain(pParse,'\x01',"MERGE (%s)");
      iVar16 = sqlite3VdbeAddOp3(pVVar22,0xd,iVar44,0,pVVar22->nOp + 1);
      pSVar42->iLimit = iVar18;
      sqlite3VdbeExplain(pParse,'\x01',"LEFT");
      sqlite3Select(pParse,pSVar42,&destA);
      sqlite3VdbeAddOp3(pVVar22,0x43,iVar44,0,0);
      pPVar7 = pVVar22->pParse;
      pPVar7->nTempReg = '\0';
      pPVar7->nRangeReg = 0;
      iVar18 = pVVar22->nOp;
      if (pVVar22->db->mallocFailed == '\0') {
        iVar17 = iVar18 + -1;
        if (-1 < iVar16) {
          iVar17 = iVar16;
        }
        pOVar27 = pVVar22->aOp + iVar17;
      }
      else {
        pOVar27 = (Op *)&sqlite3VdbeGetOp_dummy;
      }
      pOVar27->p2 = iVar18;
      iVar17 = sqlite3VdbeAddOp3(pVVar22,0xd,iVar21,0,iVar18 + 1);
      iVar18 = p->iLimit;
      iVar16 = p->iOffset;
      p->iLimit = iVar38;
      p->iOffset = 0;
      sqlite3VdbeExplain(pParse,'\x01',"RIGHT");
      sqlite3Select(pParse,p,&local_50);
      p->iLimit = iVar18;
      p->iOffset = iVar16;
      sqlite3VdbeAddOp3(pVVar22,0x43,iVar21,0,0);
      pPVar7 = pVVar22->pParse;
      pPVar7->nTempReg = '\0';
      iVar18 = 0;
      pPVar7->nRangeReg = 0;
      iVar38 = generateOutputSubroutine(pParse,p,&destA,pDest,iVar40,iVar34,pKVar25,uVar14);
      if ((byte)(uVar36 + 0x85) < 2) {
        iVar18 = generateOutputSubroutine(pParse,p,&local_50,pDest,iVar29,iVar34,pKVar25,uVar14);
      }
      if ((pKVar25 != (KeyInfo *)0x0) && (pKVar25->nRef = pKVar25->nRef - 1, pKVar25->nRef == 0)) {
        sqlite3DbFreeNN(pKVar25->db,pKVar25);
      }
      if ((byte)(uVar36 + 0x83) < 2) {
        p2 = uVar14;
        uVar19 = uVar14;
        if (uVar36 != '~') goto LAB_00172df8;
        p2_00 = uVar14;
        if (pSVar42->nSelectRow < p->nSelectRow) {
          p->nSelectRow = pSVar42->nSelectRow;
        }
      }
      else {
        p2 = sqlite3VdbeAddOp3(pVVar22,0xc,iVar29,iVar18,0);
        uVar19 = sqlite3VdbeAddOp3(pVVar22,0xe,iVar21,uVar14,0);
        sqlite3VdbeAddOp3(pVVar22,0xb,0,p2,0);
        LVar13 = sqlite3LogEstAdd(p->nSelectRow,pSVar42->nSelectRow);
        p->nSelectRow = LVar13;
LAB_00172df8:
        p2_00 = sqlite3VdbeAddOp3(pVVar22,0xc,iVar40,iVar38,0);
        sqlite3VdbeAddOp3(pVVar22,0xe,iVar44,uVar14,0);
        sqlite3VdbeAddOp3(pVVar22,0xb,0,p2_00,0);
      }
      iVar34 = sqlite3VdbeAddOp3(pVVar22,0xc,iVar40,iVar38,0);
      sqlite3VdbeAddOp3(pVVar22,0xe,iVar44,p2,0);
      sqlite3VdbeAddOp3(pVVar22,0xb,0,uVar15,0);
      iVar38 = iVar34;
      if (uVar36 == '|') {
        iVar40 = pVVar22->nOp;
      }
      else {
        if (uVar36 == '~') {
          iVar40 = pVVar22->nOp;
          iVar34 = iVar34 + 1;
          goto LAB_00172ee9;
        }
        iVar38 = sqlite3VdbeAddOp3(pVVar22,0xe,iVar44,p2,0);
        sqlite3VdbeAddOp3(pVVar22,0xb,0,uVar15,0);
        iVar40 = pVVar22->nOp;
        if (1 < (byte)(uVar36 + 0x85)) goto LAB_00172ee9;
      }
      sqlite3VdbeAddOp3(pVVar22,0xc,iVar29,iVar18,0);
LAB_00172ee9:
      sqlite3VdbeAddOp3(pVVar22,0xe,iVar21,p2_00,0);
      sqlite3VdbeAddOp3(pVVar22,0xb,0,uVar15,0);
      if (pVVar22->db->mallocFailed == '\0') {
        iVar18 = pVVar22->nOp + -1;
        if (-1 < iVar17) {
          iVar18 = iVar17;
        }
        pOVar27 = pVVar22->aOp + iVar18;
      }
      else {
        pOVar27 = (Op *)&sqlite3VdbeGetOp_dummy;
      }
      pOVar27->p2 = pVVar22->nOp;
      sqlite3VdbeAddOp3(pVVar22,0xe,iVar44,uVar19,0);
      sqlite3VdbeAddOp3(pVVar22,0xe,iVar21,p2_00,0);
      piVar8 = pVVar22->pParse->aLabel;
      if (piVar8 != (int *)0x0) {
        piVar8[(int)~uVar15] = pVVar22->nOp;
      }
      iVar18 = sqlite3VdbeAddOp3(pVVar22,0x56,0,0,0);
      sqlite3VdbeChangeP4(pVVar22,iVar18,(char *)piVar23,-0xf);
      iVar20 = sqlite3VdbeAddOp3(pVVar22,0x57,destA.iSdst,local_50.iSdst,iVar20);
      sqlite3VdbeChangeP4(pVVar22,iVar20,(char *)local_e0,-9);
      if (0 < (long)pVVar22->nOp) {
        pVVar22->aOp[(long)pVVar22->nOp + -1].p5 = 1;
      }
      sqlite3VdbeAddOp3(pVVar22,0x10,iVar34,iVar38,iVar40);
      piVar23 = pVVar22->pParse->aLabel;
      if (piVar23 != (int *)0x0) {
        piVar23[(int)~uVar14] = pVVar22->nOp;
      }
      if (p->pPrior != (Select *)0x0) {
        clearSelect(psVar5,p->pPrior,1);
      }
      p->pPrior = pSVar42;
      pSVar42->pNext = p;
      sqlite3VdbeExplainPop(pParse);
      return (uint)(pParse->nErr != 0);
    }
    pcVar35 = "LIMIT";
  }
  else {
    pcVar35 = "ORDER BY";
  }
  bVar12 = p->op + 0x84;
  if (bVar12 < 3) {
    pcVar30 = (&PTR_anon_var_dwarf_25839_001bddc0)[bVar12];
  }
  else {
    pcVar30 = "UNION";
  }
  sqlite3ErrorMsg(pParse,"%s clause should come after %s not before",pcVar35,pcVar30);
  iVar20 = 1;
LAB_00172593:
  pDest->iSdst = dest.iSdst;
  pDest->nSdst = dest.nSdst;
  return iVar20;
}

Assistant:

static int multiSelect(
  Parse *pParse,        /* Parsing context */
  Select *p,            /* The right-most of SELECTs to be coded */
  SelectDest *pDest     /* What to do with query results */
){
  int rc = SQLITE_OK;   /* Success code from a subroutine */
  Select *pPrior;       /* Another SELECT immediately to our left */
  Vdbe *v;              /* Generate code to this VDBE */
  SelectDest dest;      /* Alternative data destination */
  Select *pDelete = 0;  /* Chain of simple selects to delete */
  sqlite3 *db;          /* Database connection */

  /* Make sure there is no ORDER BY or LIMIT clause on prior SELECTs.  Only
  ** the last (right-most) SELECT in the series may have an ORDER BY or LIMIT.
  */
  assert( p && p->pPrior );  /* Calling function guarantees this much */
  assert( (p->selFlags & SF_Recursive)==0 || p->op==TK_ALL || p->op==TK_UNION );
  db = pParse->db;
  pPrior = p->pPrior;
  dest = *pDest;
  if( pPrior->pOrderBy || pPrior->pLimit ){
    sqlite3ErrorMsg(pParse,"%s clause should come after %s not before",
      pPrior->pOrderBy!=0 ? "ORDER BY" : "LIMIT", selectOpName(p->op));
    rc = 1;
    goto multi_select_end;
  }

  v = sqlite3GetVdbe(pParse);
  assert( v!=0 );  /* The VDBE already created by calling function */

  /* Create the destination temporary table if necessary
  */
  if( dest.eDest==SRT_EphemTab ){
    assert( p->pEList );
    sqlite3VdbeAddOp2(v, OP_OpenEphemeral, dest.iSDParm, p->pEList->nExpr);
    dest.eDest = SRT_Table;
  }

  /* Special handling for a compound-select that originates as a VALUES clause.
  */
  if( p->selFlags & SF_MultiValue ){
    rc = multiSelectValues(pParse, p, &dest);
    goto multi_select_end;
  }

  /* Make sure all SELECTs in the statement have the same number of elements
  ** in their result sets.
  */
  assert( p->pEList && pPrior->pEList );
  assert( p->pEList->nExpr==pPrior->pEList->nExpr );

#ifndef SQLITE_OMIT_CTE
  if( p->selFlags & SF_Recursive ){
    generateWithRecursiveQuery(pParse, p, &dest);
  }else
#endif

  /* Compound SELECTs that have an ORDER BY clause are handled separately.
  */
  if( p->pOrderBy ){
    return multiSelectOrderBy(pParse, p, pDest);
  }else{

#ifndef SQLITE_OMIT_EXPLAIN
    if( pPrior->pPrior==0 ){
      ExplainQueryPlan((pParse, 1, "COMPOUND QUERY"));
      ExplainQueryPlan((pParse, 1, "LEFT-MOST SUBQUERY"));
    }
#endif

    /* Generate code for the left and right SELECT statements.
    */
    switch( p->op ){
      case TK_ALL: {
        int addr = 0;
        int nLimit;
        assert( !pPrior->pLimit );
        pPrior->iLimit = p->iLimit;
        pPrior->iOffset = p->iOffset;
        pPrior->pLimit = p->pLimit;
        rc = sqlite3Select(pParse, pPrior, &dest);
        p->pLimit = 0;
        if( rc ){
          goto multi_select_end;
        }
        p->pPrior = 0;
        p->iLimit = pPrior->iLimit;
        p->iOffset = pPrior->iOffset;
        if( p->iLimit ){
          addr = sqlite3VdbeAddOp1(v, OP_IfNot, p->iLimit); VdbeCoverage(v);
          VdbeComment((v, "Jump ahead if LIMIT reached"));
          if( p->iOffset ){
            sqlite3VdbeAddOp3(v, OP_OffsetLimit,
                              p->iLimit, p->iOffset+1, p->iOffset);
          }
        }
        ExplainQueryPlan((pParse, 1, "UNION ALL"));
        rc = sqlite3Select(pParse, p, &dest);
        testcase( rc!=SQLITE_OK );
        pDelete = p->pPrior;
        p->pPrior = pPrior;
        p->nSelectRow = sqlite3LogEstAdd(p->nSelectRow, pPrior->nSelectRow);
        if( pPrior->pLimit
         && sqlite3ExprIsInteger(pPrior->pLimit->pLeft, &nLimit)
         && nLimit>0 && p->nSelectRow > sqlite3LogEst((u64)nLimit) 
        ){
          p->nSelectRow = sqlite3LogEst((u64)nLimit);
        }
        if( addr ){
          sqlite3VdbeJumpHere(v, addr);
        }
        break;
      }
      case TK_EXCEPT:
      case TK_UNION: {
        int unionTab;    /* Cursor number of the temp table holding result */
        u8 op = 0;       /* One of the SRT_ operations to apply to self */
        int priorOp;     /* The SRT_ operation to apply to prior selects */
        Expr *pLimit;    /* Saved values of p->nLimit  */
        int addr;
        SelectDest uniondest;
  
        testcase( p->op==TK_EXCEPT );
        testcase( p->op==TK_UNION );
        priorOp = SRT_Union;
        if( dest.eDest==priorOp ){
          /* We can reuse a temporary table generated by a SELECT to our
          ** right.
          */
          assert( p->pLimit==0 );      /* Not allowed on leftward elements */
          unionTab = dest.iSDParm;
        }else{
          /* We will need to create our own temporary table to hold the
          ** intermediate results.
          */
          unionTab = pParse->nTab++;
          assert( p->pOrderBy==0 );
          addr = sqlite3VdbeAddOp2(v, OP_OpenEphemeral, unionTab, 0);
          assert( p->addrOpenEphm[0] == -1 );
          p->addrOpenEphm[0] = addr;
          findRightmost(p)->selFlags |= SF_UsesEphemeral;
          assert( p->pEList );
        }
  
        /* Code the SELECT statements to our left
        */
        assert( !pPrior->pOrderBy );
        sqlite3SelectDestInit(&uniondest, priorOp, unionTab);
        rc = sqlite3Select(pParse, pPrior, &uniondest);
        if( rc ){
          goto multi_select_end;
        }
  
        /* Code the current SELECT statement
        */
        if( p->op==TK_EXCEPT ){
          op = SRT_Except;
        }else{
          assert( p->op==TK_UNION );
          op = SRT_Union;
        }
        p->pPrior = 0;
        pLimit = p->pLimit;
        p->pLimit = 0;
        uniondest.eDest = op;
        ExplainQueryPlan((pParse, 1, "%s USING TEMP B-TREE",
                          selectOpName(p->op)));
        rc = sqlite3Select(pParse, p, &uniondest);
        testcase( rc!=SQLITE_OK );
        /* Query flattening in sqlite3Select() might refill p->pOrderBy.
        ** Be sure to delete p->pOrderBy, therefore, to avoid a memory leak. */
        sqlite3ExprListDelete(db, p->pOrderBy);
        pDelete = p->pPrior;
        p->pPrior = pPrior;
        p->pOrderBy = 0;
        if( p->op==TK_UNION ){
          p->nSelectRow = sqlite3LogEstAdd(p->nSelectRow, pPrior->nSelectRow);
        }
        sqlite3ExprDelete(db, p->pLimit);
        p->pLimit = pLimit;
        p->iLimit = 0;
        p->iOffset = 0;
  
        /* Convert the data in the temporary table into whatever form
        ** it is that we currently need.
        */
        assert( unionTab==dest.iSDParm || dest.eDest!=priorOp );
        if( dest.eDest!=priorOp ){
          int iCont, iBreak, iStart;
          assert( p->pEList );
          iBreak = sqlite3VdbeMakeLabel(v);
          iCont = sqlite3VdbeMakeLabel(v);
          computeLimitRegisters(pParse, p, iBreak);
          sqlite3VdbeAddOp2(v, OP_Rewind, unionTab, iBreak); VdbeCoverage(v);
          iStart = sqlite3VdbeCurrentAddr(v);
          selectInnerLoop(pParse, p, unionTab,
                          0, 0, &dest, iCont, iBreak);
          sqlite3VdbeResolveLabel(v, iCont);
          sqlite3VdbeAddOp2(v, OP_Next, unionTab, iStart); VdbeCoverage(v);
          sqlite3VdbeResolveLabel(v, iBreak);
          sqlite3VdbeAddOp2(v, OP_Close, unionTab, 0);
        }
        break;
      }
      default: assert( p->op==TK_INTERSECT ); {
        int tab1, tab2;
        int iCont, iBreak, iStart;
        Expr *pLimit;
        int addr;
        SelectDest intersectdest;
        int r1;
  
        /* INTERSECT is different from the others since it requires
        ** two temporary tables.  Hence it has its own case.  Begin
        ** by allocating the tables we will need.
        */
        tab1 = pParse->nTab++;
        tab2 = pParse->nTab++;
        assert( p->pOrderBy==0 );
  
        addr = sqlite3VdbeAddOp2(v, OP_OpenEphemeral, tab1, 0);
        assert( p->addrOpenEphm[0] == -1 );
        p->addrOpenEphm[0] = addr;
        findRightmost(p)->selFlags |= SF_UsesEphemeral;
        assert( p->pEList );
  
        /* Code the SELECTs to our left into temporary table "tab1".
        */
        sqlite3SelectDestInit(&intersectdest, SRT_Union, tab1);
        rc = sqlite3Select(pParse, pPrior, &intersectdest);
        if( rc ){
          goto multi_select_end;
        }
  
        /* Code the current SELECT into temporary table "tab2"
        */
        addr = sqlite3VdbeAddOp2(v, OP_OpenEphemeral, tab2, 0);
        assert( p->addrOpenEphm[1] == -1 );
        p->addrOpenEphm[1] = addr;
        p->pPrior = 0;
        pLimit = p->pLimit;
        p->pLimit = 0;
        intersectdest.iSDParm = tab2;
        ExplainQueryPlan((pParse, 1, "%s USING TEMP B-TREE",
                          selectOpName(p->op)));
        rc = sqlite3Select(pParse, p, &intersectdest);
        testcase( rc!=SQLITE_OK );
        pDelete = p->pPrior;
        p->pPrior = pPrior;
        if( p->nSelectRow>pPrior->nSelectRow ){
          p->nSelectRow = pPrior->nSelectRow;
        }
        sqlite3ExprDelete(db, p->pLimit);
        p->pLimit = pLimit;
  
        /* Generate code to take the intersection of the two temporary
        ** tables.
        */
        assert( p->pEList );
        iBreak = sqlite3VdbeMakeLabel(v);
        iCont = sqlite3VdbeMakeLabel(v);
        computeLimitRegisters(pParse, p, iBreak);
        sqlite3VdbeAddOp2(v, OP_Rewind, tab1, iBreak); VdbeCoverage(v);
        r1 = sqlite3GetTempReg(pParse);
        iStart = sqlite3VdbeAddOp2(v, OP_RowData, tab1, r1);
        sqlite3VdbeAddOp4Int(v, OP_NotFound, tab2, iCont, r1, 0);
        VdbeCoverage(v);
        sqlite3ReleaseTempReg(pParse, r1);
        selectInnerLoop(pParse, p, tab1,
                        0, 0, &dest, iCont, iBreak);
        sqlite3VdbeResolveLabel(v, iCont);
        sqlite3VdbeAddOp2(v, OP_Next, tab1, iStart); VdbeCoverage(v);
        sqlite3VdbeResolveLabel(v, iBreak);
        sqlite3VdbeAddOp2(v, OP_Close, tab2, 0);
        sqlite3VdbeAddOp2(v, OP_Close, tab1, 0);
        break;
      }
    }
  
  #ifndef SQLITE_OMIT_EXPLAIN
    if( p->pNext==0 ){
      ExplainQueryPlanPop(pParse);
    }
  #endif
  }
  
  /* Compute collating sequences used by 
  ** temporary tables needed to implement the compound select.
  ** Attach the KeyInfo structure to all temporary tables.
  **
  ** This section is run by the right-most SELECT statement only.
  ** SELECT statements to the left always skip this part.  The right-most
  ** SELECT might also skip this part if it has no ORDER BY clause and
  ** no temp tables are required.
  */
  if( p->selFlags & SF_UsesEphemeral ){
    int i;                        /* Loop counter */
    KeyInfo *pKeyInfo;            /* Collating sequence for the result set */
    Select *pLoop;                /* For looping through SELECT statements */
    CollSeq **apColl;             /* For looping through pKeyInfo->aColl[] */
    int nCol;                     /* Number of columns in result set */

    assert( p->pNext==0 );
    nCol = p->pEList->nExpr;
    pKeyInfo = sqlite3KeyInfoAlloc(db, nCol, 1);
    if( !pKeyInfo ){
      rc = SQLITE_NOMEM_BKPT;
      goto multi_select_end;
    }
    for(i=0, apColl=pKeyInfo->aColl; i<nCol; i++, apColl++){
      *apColl = multiSelectCollSeq(pParse, p, i);
      if( 0==*apColl ){
        *apColl = db->pDfltColl;
      }
    }

    for(pLoop=p; pLoop; pLoop=pLoop->pPrior){
      for(i=0; i<2; i++){
        int addr = pLoop->addrOpenEphm[i];
        if( addr<0 ){
          /* If [0] is unused then [1] is also unused.  So we can
          ** always safely abort as soon as the first unused slot is found */
          assert( pLoop->addrOpenEphm[1]<0 );
          break;
        }
        sqlite3VdbeChangeP2(v, addr, nCol);
        sqlite3VdbeChangeP4(v, addr, (char*)sqlite3KeyInfoRef(pKeyInfo),
                            P4_KEYINFO);
        pLoop->addrOpenEphm[i] = -1;
      }
    }
    sqlite3KeyInfoUnref(pKeyInfo);
  }

multi_select_end:
  pDest->iSdst = dest.iSdst;
  pDest->nSdst = dest.nSdst;
  sqlite3SelectDelete(db, pDelete);
  return rc;
}